

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

void __thiscall
pstore::region::factory::append<pstore::file::file_handle,pstore::memory_mapper>
          (factory *this,shared_ptr<pstore::file::file_handle> *file,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t original_size,uint64_t new_size)

{
  uint64_t full_size;
  char *__file;
  element_type *this_00;
  __off_t __length;
  shared_ptr<pstore::file::file_handle> local_68;
  undefined1 local_58 [8];
  region_builder<pstore::file::file_handle,_pstore::memory_mapper> builder;
  uint64_t min_size;
  uint64_t new_size_local;
  uint64_t original_size_local;
  shared_ptr<pstore::file::file_handle> *file_local;
  factory *this_local;
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  regions_local;
  
  if (original_size <= new_size) {
    builder.minimum_size_ = factory::min_size(this);
    std::shared_ptr<pstore::file::file_handle>::shared_ptr(&local_68,file);
    full_size = factory::full_size(this);
    region_builder<pstore::file::file_handle,_pstore::memory_mapper>::region_builder
              ((region_builder<pstore::file::file_handle,_pstore::memory_mapper> *)local_58,
               &local_68,full_size,builder.minimum_size_);
    std::shared_ptr<pstore::file::file_handle>::~shared_ptr(&local_68);
    __file = (char *)round_up(new_size,builder.minimum_size_);
    this_00 = std::
              __shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pstore::file::file_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)file);
    pstore::file::file_handle::truncate(this_00,__file,__length);
    region_builder<pstore::file::file_handle,_pstore::memory_mapper>::append
              ((region_builder<pstore::file::file_handle,_pstore::memory_mapper> *)local_58,regions,
               original_size,(long)__file - original_size);
    region_builder<pstore::file::file_handle,_pstore::memory_mapper>::~region_builder
              ((region_builder<pstore::file::file_handle,_pstore::memory_mapper> *)local_58);
    return;
  }
  assert_failed("new_size >= original_size",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                ,0x111);
}

Assistant:

void factory::append (std::shared_ptr<File> file,
                              gsl::not_null<std::vector<memory_mapper_ptr> *> regions,
                              std::uint64_t original_size, std::uint64_t new_size) {

            PSTORE_ASSERT (new_size >= original_size);

            auto const min_size = this->min_size ();
            region_builder<File, MemoryMapper> builder (file, this->full_size (), min_size);

            new_size = round_up (new_size, min_size);
            if (!small_files_enabled ()) {
                file->truncate (new_size);
            }
            builder.append (regions, original_size, new_size - original_size);
        }